

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O0

path * helper::resolve(path *__return_storage_ptr__,path *p,path *base)

{
  type_conflict2 tVar1;
  bool bVar2;
  reference ppVar3;
  type local_128;
  path local_f8;
  path local_d8;
  iterator local_b8;
  undefined1 local_88 [8];
  iterator it;
  undefined1 local_48 [8];
  path absolute;
  path *base_local;
  path *p_local;
  path *ret;
  
  absolute.m_pathname.field_2._M_local_buf[0xf] = '\0';
  boost::filesystem::path::path(__return_storage_ptr__);
  boost::filesystem::absolute((path *)local_48,p,base);
  boost::filesystem::path::begin();
  while( true ) {
    boost::filesystem::path::end();
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)local_88,
                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)&local_b8);
    boost::filesystem::path::iterator::~iterator(&local_b8);
    if (!tVar1) break;
    ppVar3 = boost::iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                          *)local_88);
    bVar2 = boost::filesystem::operator==(ppVar3,"..");
    if (bVar2) {
      bVar2 = boost::filesystem::is_symlink(__return_storage_ptr__);
      if (bVar2) {
        ppVar3 = boost::iterators::detail::
                 iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                              *)local_88);
        boost::filesystem::path::operator/=(__return_storage_ptr__,ppVar3);
      }
      else {
        boost::filesystem::path::filename();
        bVar2 = boost::filesystem::operator==(&local_d8,"..");
        boost::filesystem::path::~path(&local_d8);
        if (bVar2) {
          ppVar3 = boost::iterators::detail::
                   iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                *)local_88);
          boost::filesystem::path::operator/=(__return_storage_ptr__,ppVar3);
        }
        else {
          boost::filesystem::path::parent_path();
          boost::filesystem::path::operator=(__return_storage_ptr__,&local_f8);
          boost::filesystem::path::~path(&local_f8);
        }
      }
    }
    else {
      ppVar3 = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                            *)local_88);
      bVar2 = boost::filesystem::operator==(ppVar3,".");
      if (!bVar2) {
        ppVar3 = boost::iterators::detail::
                 iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                              *)local_88);
        boost::filesystem::path::operator/=(__return_storage_ptr__,ppVar3);
      }
    }
    boost::iterators::operator++
              (&local_128,
               (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                *)local_88,0);
    boost::filesystem::path::iterator::~iterator(&local_128);
  }
  boost::filesystem::path::iterator::~iterator((iterator *)local_88);
  absolute.m_pathname.field_2._M_local_buf[0xf] = '\x01';
  boost::filesystem::path::~path((path *)local_48);
  if ((absolute.m_pathname.field_2._M_local_buf[0xf] & 1U) == 0) {
    boost::filesystem::path::~path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path resolve( const fs::path &p, const fs::path &base )
	{
		fs::path ret;
		fs::path absolute = fs::absolute( p, base );

		for( fs::path::iterator it = absolute.begin() ; it != absolute.end() ; it++ )
		{
			if( *it == ".." )
			{//Go one dir backwars
				if( fs::is_symlink( ret ) )
				{//Check for symlinks
					ret /= *it;
				}
				else if( ret.filename() == ".." )
				{//Multiple ..s'
					ret /= *it;
				}
				// Otherwise it should be safe to resolve the parent
				else
					ret = ret.parent_path();
			}
			else if( *it == "." );//Ignore
			else
			{//Normal dirs
				ret /= *it;
			}
		}
		return ret;
	}